

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

void __thiscall Table::define_column_type(Table *this,int cnt,types tp)

{
  pointer ptVar1;
  pointer ptVar2;
  _Vector_base<double,_std::allocator<double>_> local_48;
  pair<int,_std::vector<double,_std::allocator<double>_>_> local_30;
  
  ptVar2 = (this->columns).
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ptVar1 = ptVar2 + cnt;
  ptVar2[cnt].
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
  .super__Tuple_impl<1UL,_Table::types,_int>.super__Head_base<1UL,_Table::types,_false>._M_head_impl
       = tp;
  local_30.first = cnt;
  if (tp == STRING) {
    (ptVar1->
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
    ).super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int> =
         (_Tuple_impl<2UL,_int>)
         (int)((ulong)((long)(this->string_cols).
                             super__Vector_base<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->string_cols).
                            super__Vector_base<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5);
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_30.second,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48);
    std::
    vector<std::pair<int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
    ::
    emplace_back<std::pair<int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::pair<int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::allocator<std::pair<int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                *)&this->string_cols,
               (pair<int,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_30);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_30.second);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
  }
  else if (tp == FLOAT) {
    (ptVar1->
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
    ).super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int> =
         (_Tuple_impl<2UL,_int>)
         (int)((ulong)((long)(this->float_cols).
                             super__Vector_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->float_cols).
                            super__Vector_base<std::pair<int,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<std::pair<int,_std::vector<double,_std::allocator<double>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5);
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_30.second,(vector<double,_std::allocator<double>_> *)&local_48);
    std::
    vector<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
    ::emplace_back<std::pair<int,std::vector<double,std::allocator<double>>>>
              ((vector<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>
                *)&this->float_cols,&local_30);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&local_30.second.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  else {
    if (tp != INT) {
      std::operator<<((ostream *)&std::cerr,"Trying to define_column_type to UNDEFINED\n");
      exit(1);
    }
    (ptVar1->
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table::types,_int>
    ).super__Tuple_impl<1UL,_Table::types,_int>.super__Tuple_impl<2UL,_int> =
         (_Tuple_impl<2UL,_int>)
         (int)((ulong)((long)(this->int_cols).
                             super__Vector_base<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->int_cols).
                            super__Vector_base<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>,_std::allocator<std::pair<int,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 5);
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<long_long,_std::allocator<long_long>_>::vector
              ((vector<long_long,_std::allocator<long_long>_> *)&local_30.second,
               (vector<long_long,_std::allocator<long_long>_> *)&local_48);
    std::
    vector<std::pair<int,std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::pair<int,std::vector<long_long,std::allocator<long_long>>>>>
    ::emplace_back<std::pair<int,std::vector<long_long,std::allocator<long_long>>>>
              ((vector<std::pair<int,std::vector<long_long,std::allocator<long_long>>>,std::allocator<std::pair<int,std::vector<long_long,std::allocator<long_long>>>>>
                *)&this->int_cols,
               (pair<int,_std::vector<long_long,_std::allocator<long_long>_>_> *)&local_30);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_30.second);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_48);
  }
  return;
}

Assistant:

void Table::define_column_type(int cnt, types tp){
    std::get<1>(columns[cnt]) = tp;
    switch (tp) {
        case INT:
            std::get<2>(columns[cnt]) = int_cols.size();
            int_cols.push_back({cnt, {}});
            break;
        case FLOAT:
            std::get<2>(columns[cnt]) = float_cols.size();
            float_cols.push_back({cnt, {}});
            break;
        case STRING:
            std::get<2>(columns[cnt]) = string_cols.size();
            string_cols.push_back({cnt, {}});
            break;
        default:
            std::cerr << "Trying to define_column_type to UNDEFINED\n";
            exit(EXIT_FAILURE);
    }
}